

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O3

void __thiscall MapWriter_read_Test::~MapWriter_read_Test(MapWriter_read_Test *this)

{
  pointer puVar1;
  
  (this->super_MapWriter).super_Test._vptr_Test = (_func_int **)&PTR__MapWriter_00197200;
  pstore::serialize::archive::vector_writer::~vector_writer(&(this->super_MapWriter).writer_);
  puVar1 = (this->super_MapWriter).bytes_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_MapWriter).bytes_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F (MapWriter, read) {
    auto archive = pstore::serialize::archive::make_reader (std::begin (writer_));
    MapWriter::map_type const actual = pstore::serialize::read<MapWriter::map_type> (archive);
    EXPECT_EQ (map_, actual);
    EXPECT_EQ (std::end (writer_), archive.iterator ());
}